

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

pair<bool,_Point> intersection(Segment *segment,Triangle *triangle)

{
  bool bVar1;
  float fVar2;
  Point PVar3;
  Vector VVar4;
  Point PVar5;
  Point local_248;
  bool local_23a;
  bool local_239;
  Point local_238;
  undefined8 local_228;
  float local_220;
  Point local_218;
  Vector local_208;
  Vector local_1f8;
  Point local_1e8;
  undefined8 local_1d8;
  float local_1d0;
  undefined1 local_1cc [8];
  Point res;
  float t;
  bool local_1ad;
  float local_1ac;
  float fStack_1a8;
  float v;
  float local_1a0;
  undefined1 local_198 [8];
  Vector Q;
  bool local_17d;
  float local_17c;
  float fStack_178;
  float u;
  float local_170;
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  float local_150;
  undefined1 local_14c [8];
  Vector T;
  float inv_det;
  bool local_12d;
  float local_12c;
  float fStack_128;
  float det;
  float local_120;
  undefined1 local_114 [8];
  Vector P;
  float local_100;
  undefined1 local_d8 [8];
  Vector e2;
  float fStack_c4;
  float local_c0;
  undefined1 local_98 [8];
  Vector e1;
  float fStack_84;
  float local_80;
  Vector local_78 [4];
  Vector local_48;
  undefined1 local_38 [8];
  Vector D;
  Triangle *triangle_local;
  Segment *segment_local;
  
  unique0x10000466 = triangle;
  PVar3 = operator-(segment->b,&segment->a);
  local_78[0].z = PVar3.z;
  local_48.z = local_78[0].z;
  local_78[0]._0_8_ = PVar3._0_8_;
  local_48.x = local_78[0].x;
  local_48.y = local_78[0].y;
  VVar4 = normalize(&local_48);
  local_80 = VVar4.z;
  D.x = local_80;
  stack0xffffffffffffff78 = VVar4._0_8_;
  local_38._0_4_ = e1.z;
  local_38._4_4_ = fStack_84;
  unique0x1000045a = VVar4;
  PVar3 = operator-(stack0xffffffffffffffd8->y,&stack0xffffffffffffffd8->x);
  local_c0 = PVar3.z;
  e1.x = local_c0;
  stack0xffffffffffffff38 = PVar3._0_8_;
  local_98._0_4_ = e2.z;
  local_98._4_4_ = fStack_c4;
  unique0x1000044e = PVar3;
  PVar3 = operator-(stack0xffffffffffffffd8->z,&stack0xffffffffffffffd8->x);
  local_100 = PVar3.z;
  e2.x = local_100;
  P._4_8_ = PVar3._0_8_;
  local_d8._0_4_ = P.y;
  local_d8._4_4_ = P.z;
  unique0x10000442 = PVar3;
  VVar4 = crossProduct((Vector *)local_38,(Vector *)local_d8);
  _fStack_128 = VVar4._0_8_;
  local_114._0_4_ = fStack_128;
  local_114._4_4_ = det;
  local_120 = VVar4.z;
  P.x = local_120;
  _fStack_128 = VVar4;
  local_12c = dotProduct((Vector *)local_98,(Vector *)local_114);
  bVar1 = isCloseToZero<float>(local_12c);
  if (bVar1) {
    local_12d = false;
    T.z = 0.0;
    std::pair<bool,_Point>::pair<bool,_true>
              ((pair<bool,_Point> *)&segment_local,&local_12d,(Point *)&T.z);
  }
  else {
    T.y = 1.0 / local_12c;
    local_160 = (segment->a).z;
    local_168._0_4_ = (segment->a).x;
    local_168._4_4_ = (segment->a).y;
    local_158 = local_168;
    local_150 = local_160;
    PVar3 = operator-(segment->a,&stack0xffffffffffffffd8->x);
    _fStack_178 = PVar3._0_8_;
    local_14c._0_4_ = fStack_178;
    local_14c._4_4_ = u;
    local_170 = PVar3.z;
    T.x = local_170;
    _fStack_178 = PVar3;
    local_17c = dotProduct((Vector *)local_14c,(Vector *)local_114);
    local_17c = local_17c * T.y;
    if ((local_17c < 0.0) || (1.0 < local_17c)) {
      local_17d = false;
      Q.y = 0.0;
      Q.z = 0.0;
      std::pair<bool,_Point>::pair<bool,_true>
                ((pair<bool,_Point> *)&segment_local,&local_17d,(Point *)&Q.y);
    }
    else {
      VVar4 = crossProduct((Vector *)local_14c,(Vector *)local_98);
      _fStack_1a8 = VVar4._0_8_;
      local_198._0_4_ = fStack_1a8;
      local_198._4_4_ = v;
      local_1a0 = VVar4.z;
      Q.x = local_1a0;
      _fStack_1a8 = VVar4;
      local_1ac = dotProduct((Vector *)local_38,(Vector *)local_198);
      local_1ac = local_1ac * T.y;
      if ((local_1ac < 0.0) || (1.0 < local_17c + local_1ac)) {
        local_1ad = false;
        res.z = 0.0;
        std::pair<bool,_Point>::pair<bool,_true>
                  ((pair<bool,_Point> *)&segment_local,&local_1ad,(Point *)&res.z);
      }
      else {
        fVar2 = dotProduct((Vector *)local_d8,(Vector *)local_198);
        res.y = fVar2 * T.y;
        if (res.y <= 0.0) {
          local_23a = false;
          local_248.x = 0.0;
          local_248.y = 0.0;
          local_248.z = 0.0;
          std::pair<bool,_Point>::pair<bool,_true>
                    ((pair<bool,_Point> *)&segment_local,&local_23a,&local_248);
        }
        else {
          local_1d0 = (segment->a).z;
          local_1d8._0_4_ = (segment->a).x;
          local_1d8._4_4_ = (segment->a).y;
          local_1f8.z = D.x;
          local_1f8.x = (float)local_38._0_4_;
          local_1f8.y = (float)local_38._4_4_;
          local_208.z = D.x;
          local_208.x = (float)local_38._0_4_;
          local_208.y = (float)local_38._4_4_;
          PVar5.z = D.x;
          PVar5.x = (float)local_38._0_4_;
          PVar5.y = (float)local_38._4_4_;
          PVar5 = operator*(PVar5,res.y);
          local_218.z = PVar5.z;
          local_1e8.z = local_218.z;
          local_218._0_8_ = PVar5._0_8_;
          local_1e8.x = local_218.x;
          local_1e8.y = local_218.y;
          local_220 = local_1d0;
          local_228 = local_1d8;
          PVar3.z = local_1d0;
          PVar3.x = (float)(undefined4)local_1d8;
          PVar3.y = (float)local_1d8._4_4_;
          local_218 = PVar5;
          PVar3 = operator+(PVar3,&local_1e8);
          local_238._0_8_ = PVar3._0_8_;
          local_1cc._0_4_ = local_238.x;
          local_1cc._4_4_ = local_238.y;
          local_238.z = PVar3.z;
          res.x = local_238.z;
          local_239 = true;
          local_238 = PVar3;
          std::pair<bool,_Point>::pair<bool,_Point_&,_true>
                    ((pair<bool,_Point> *)&segment_local,&local_239,(Point *)local_1cc);
        }
      }
    }
  }
  return _segment_local;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res};
  }

  return {false, {}};
}